

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

UInt32 CrcUpdateT4(UInt32 v,void *data,size_t size,UInt32 *table)

{
  uint uVar1;
  uint *local_30;
  Byte *p;
  UInt32 *table_local;
  size_t size_local;
  void *data_local;
  UInt32 v_local;
  
  local_30 = (uint *)data;
  data_local._4_4_ = v;
  for (table_local = (UInt32 *)size; table_local != (UInt32 *)0x0 && ((ulong)local_30 & 3) != 0;
      table_local = (UInt32 *)((long)table_local + -1)) {
    data_local._4_4_ = table[(data_local._4_4_ ^ (byte)*local_30) & 0xff] ^ data_local._4_4_ >> 8;
    local_30 = (uint *)((long)local_30 + 1);
  }
  for (; (UInt32 *)0x3 < table_local; table_local = table_local + -1) {
    uVar1 = *local_30 ^ data_local._4_4_;
    data_local._4_4_ =
         table[(uVar1 & 0xff) + 0x300] ^ table[(uVar1 >> 8 & 0xff) + 0x200] ^
         table[(uVar1 >> 0x10 & 0xff) + 0x100] ^ table[uVar1 >> 0x18];
    local_30 = local_30 + 1;
  }
  for (; table_local != (UInt32 *)0x0; table_local = (UInt32 *)((long)table_local + -1)) {
    data_local._4_4_ = table[(data_local._4_4_ ^ (byte)*local_30) & 0xff] ^ data_local._4_4_ >> 8;
    local_30 = (uint *)((long)local_30 + 1);
  }
  return data_local._4_4_;
}

Assistant:

static UInt32 MY_FAST_CALL CrcUpdateT4(UInt32 v, const void *data, size_t size, const UInt32 *table)
{
  const Byte *p = (const Byte *)data;
  for (; size > 0 && ((unsigned)(ptrdiff_t)p & 3) != 0; size--, p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  for (; size >= 4; size -= 4, p += 4)
  {
    v ^= *(const UInt32 *)p;
    v =
          table[0x300 + ((v      ) & 0xFF)]
        ^ table[0x200 + ((v >>  8) & 0xFF)]
        ^ table[0x100 + ((v >> 16) & 0xFF)]
        ^ table[0x000 + ((v >> 24))];
  }
  for (; size > 0; size--, p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  return v;
}